

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

uint cpu_feature_bits(void)

{
  int iVar1;
  uint32_t local_28 [2];
  uint32_t regs [4];
  uint local_c;
  uint features;
  
  local_c = 0;
  local_28[0] = 1;
  local_28[1] = 0;
  regs[0] = 0;
  regs[1] = 0;
  iVar1 = execute_cpuid(local_28);
  if (iVar1 != 0) {
    local_c = (uint)((regs._0_8_ & 0x400000000000000) != 0);
    if ((regs._0_8_ & 1) != 0) {
      local_c = local_c | 2;
    }
    if ((regs._0_8_ & 0x80000) != 0) {
      local_c = local_c | 4;
    }
    if ((regs._0_8_ & 0x100000) != 0) {
      local_c = local_c | 8;
    }
    if ((regs._0_8_ & 0x10000000) != 0) {
      local_c = local_c | 0x10;
    }
  }
  return local_c;
}

Assistant:

PRIVATE unsigned int
cpu_feature_bits(void)
{
  unsigned int  features = VRNA_CPU_SIMD_NONE;

  uint32_t      regs[4] = {
    1, 0, 0, 0
  };

  if (execute_cpuid(&regs[0])) {
    if (regs[3] & bit_SSE2)
      features |= VRNA_CPU_SIMD_SSE2;

    if (regs[2] & bit_SSE3)
      features |= VRNA_CPU_SIMD_SSE3;

    if (regs[2] & bit_SSE41)
      features |= VRNA_CPU_SIMD_SSE41;

    if (regs[2] & bit_SSE42)
      features |= VRNA_CPU_SIMD_SSE42;

    if (regs[2] & bit_AVX)
      features |= VRNA_CPU_SIMD_AVX;
  }

  return features;
}